

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::Generate
          (ImmutableServiceGenerator *this,Printer *printer)

{
  ServiceDescriptor *descriptor;
  Context *context;
  Printer *pPVar1;
  char *pcVar2;
  string *psVar3;
  FileDescriptor *descriptor_00;
  int __c;
  int i;
  ClassNameResolver *this_00;
  string local_c0;
  string local_a0;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  byte local_19;
  Printer *pPStack_18;
  bool is_own_file;
  Printer *printer_local;
  ImmutableServiceGenerator *this_local;
  
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  local_19 = IsOwnFile<google::protobuf::ServiceDescriptor>
                       ((this->super_ServiceGenerator).descriptor_,true);
  WriteServiceDocComment(pPStack_18,(this->super_ServiceGenerator).descriptor_);
  pPVar1 = pPStack_18;
  descriptor = (this->super_ServiceGenerator).descriptor_;
  context = this->context_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"",&local_41);
  MaybePrintGeneratedAnnotation<google::protobuf::ServiceDescriptor_const>
            (context,pPVar1,descriptor,true,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pPVar1 = pPStack_18;
  pcVar2 = "static";
  if ((local_19 & 1) != 0) {
    pcVar2 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,pcVar2,&local_79);
  psVar3 = ServiceDescriptor::name_abi_cxx11_((this->super_ServiceGenerator).descriptor_);
  io::Printer::Print(pPVar1,
                     "public $static$ abstract class $classname$\n    implements com.google.protobuf.Service {\n"
                     ,"static",&local_78,"classname",psVar3);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  io::Printer::Indent(pPStack_18);
  pPVar1 = pPStack_18;
  psVar3 = ServiceDescriptor::name_abi_cxx11_((this->super_ServiceGenerator).descriptor_);
  io::Printer::Print(pPVar1,"protected $classname$() {}\n\n","classname",psVar3);
  GenerateInterface(this,pPStack_18);
  GenerateNewReflectiveServiceMethod(this,pPStack_18);
  GenerateNewReflectiveBlockingServiceMethod(this,pPStack_18);
  GenerateAbstractMethods(this,pPStack_18);
  pPVar1 = pPStack_18;
  this_00 = this->name_resolver_;
  descriptor_00 = ServiceDescriptor::file((this->super_ServiceGenerator).descriptor_);
  ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
            (&local_a0,this_00,descriptor_00);
  pcVar2 = ServiceDescriptor::index((this->super_ServiceGenerator).descriptor_,(char *)this_00,__c);
  SimpleItoa_abi_cxx11_(&local_c0,(protobuf *)((ulong)pcVar2 & 0xffffffff),i);
  io::Printer::Print(pPVar1,
                     "public static final\n    com.google.protobuf.Descriptors.ServiceDescriptor\n    getDescriptor() {\n  return $file$.getDescriptor().getServices().get($index$);\n}\n"
                     ,"file",&local_a0,"index",&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  GenerateGetDescriptorForType(this,pPStack_18);
  GenerateCallMethod(this,pPStack_18);
  GenerateGetPrototype(this,REQUEST,pPStack_18);
  GenerateGetPrototype(this,RESPONSE,pPStack_18);
  GenerateStub(this,pPStack_18);
  GenerateBlockingStub(this,pPStack_18);
  pPVar1 = pPStack_18;
  psVar3 = ServiceDescriptor::full_name_abi_cxx11_((this->super_ServiceGenerator).descriptor_);
  io::Printer::Print(pPVar1,"\n// @@protoc_insertion_point(class_scope:$full_name$)\n","full_name",
                     psVar3);
  io::Printer::Outdent(pPStack_18);
  io::Printer::Print(pPStack_18,"}\n\n");
  return;
}

Assistant:

void ImmutableServiceGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);
  WriteServiceDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);
  printer->Print(
    "public $static$ abstract class $classname$\n"
    "    implements com.google.protobuf.Service {\n",
    "static", is_own_file ? "" : "static",
    "classname", descriptor_->name());
  printer->Indent();

  printer->Print(
    "protected $classname$() {}\n\n",
    "classname", descriptor_->name());

  GenerateInterface(printer);

  GenerateNewReflectiveServiceMethod(printer);
  GenerateNewReflectiveBlockingServiceMethod(printer);

  GenerateAbstractMethods(printer);

  // Generate getDescriptor() and getDescriptorForType().
  printer->Print(
    "public static final\n"
    "    com.google.protobuf.Descriptors.ServiceDescriptor\n"
    "    getDescriptor() {\n"
    "  return $file$.getDescriptor().getServices().get($index$);\n"
    "}\n",
    "file", name_resolver_->GetImmutableClassName(descriptor_->file()),
    "index", SimpleItoa(descriptor_->index()));
  GenerateGetDescriptorForType(printer);

  // Generate more stuff.
  GenerateCallMethod(printer);
  GenerateGetPrototype(REQUEST, printer);
  GenerateGetPrototype(RESPONSE, printer);
  GenerateStub(printer);
  GenerateBlockingStub(printer);

  // Add an insertion point.
  printer->Print(
    "\n"
    "// @@protoc_insertion_point(class_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n\n");
}